

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system_catalog.cpp
# Opt level: O2

void __thiscall SystemCatalog::SystemCatalog(SystemCatalog *this)

{
  _Rb_tree_header *p_Var1;
  fstream *this_00;
  int iVar2;
  SystemCatalog *this_01;
  size_t in_RCX;
  void *__buf;
  int iVar3;
  allocator local_289;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_288;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_268;
  type _type;
  
  (this->types)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->types)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  p_Var1 = &(this->types)._M_t._M_impl.super__Rb_tree_header;
  (this->types)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->types)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->types)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this_00 = &this->catalogFile;
  std::fstream::fstream(this_00);
  std::__cxx11::string::string((string *)&local_288,"data/",&local_289);
  std::operator+(&local_268,&local_288,"SystemCatalog");
  std::fstream::fstream(&_type,(string *)&local_268,_S_out|_S_in|_S_bin);
  std::fstream::operator=(this_00,(fstream *)&_type);
  std::fstream::~fstream(&_type);
  std::__cxx11::string::~string((string *)&local_268);
  std::__cxx11::string::~string((string *)&local_288);
  if (((&this->field_0x58)[*(long *)(*(long *)this_00 + -0x18)] & 5) != 0) {
    this_01 = (SystemCatalog *)
              std::operator<<((ostream *)&std::cout,
                              "SystemCatalog file could not be found or read, creating a new one");
    std::endl<char,std::char_traits<char>>((ostream *)this_01);
    createCatalogFile(this_01);
    std::__cxx11::string::string((string *)&local_288,"data/",&local_289);
    std::operator+(&local_268,&local_288,"SystemCatalog");
    std::fstream::fstream(&_type,(string *)&local_268,_S_out|_S_in|_S_bin);
    std::fstream::operator=(this_00,(fstream *)&_type);
    std::fstream::~fstream(&_type);
    std::__cxx11::string::~string((string *)&local_268);
    std::__cxx11::string::~string((string *)&local_288);
  }
  std::istream::read((char *)this_00,(long)this);
  _type.typeName.field_2._8_8_ = &_type.typeName._M_string_length;
  _type.typeName._M_dataplus._M_p = (pointer)0x0;
  _type.typeName._M_string_length = 0;
  _type.typeName.field_2._M_allocated_capacity = 0;
  _type.cardinality = 0;
  _type._32_8_ = _type.typeName.field_2._8_8_;
  std::_Rb_tree<type,_type,_std::_Identity<type>,_std::less<type>,_std::allocator<type>_>::operator=
            (&(this->types)._M_t,
             (_Rb_tree<type,_type,_std::_Identity<type>,_std::less<type>,_std::allocator<type>_> *)
             &_type);
  std::_Rb_tree<type,_type,_std::_Identity<type>,_std::less<type>,_std::allocator<type>_>::~_Rb_tree
            ((_Rb_tree<type,_type,_std::_Identity<type>,_std::less<type>,_std::allocator<type>_> *)
             &_type);
  __buf = (void *)0x4;
  for (iVar3 = 0; iVar3 < this->numTypes; iVar3 = iVar3 + 1) {
    type::type(&_type);
    type::read(&_type,(int)this_00,__buf,in_RCX);
    std::_Rb_tree<type,type,std::_Identity<type>,std::less<type>,std::allocator<type>>::
    _M_insert_unique<type_const&>
              ((_Rb_tree<type,type,std::_Identity<type>,std::less<type>,std::allocator<type>> *)
               &this->types,&_type);
    iVar2 = calcTypeSize((uint)_type.numFields);
    __buf = (void *)(ulong)(uint)((int)__buf + iVar2);
    type::~type(&_type);
  }
  return;
}

Assistant:

SystemCatalog::SystemCatalog() {
    catalogFile = fstream(ROOT + "SystemCatalog", INOUTBIN);

    if (!catalogFile) {
        cout << "SystemCatalog file could not be found or read, creating a new one" << endl;

        this->createCatalogFile();

        catalogFile = fstream(ROOT + "SystemCatalog", INOUTBIN);
    }

    catalogFile.read((char *) &numTypes, NUM_TYPES);

    types = set<type>();

    int offset = NUM_TYPES;

    for (int i = 0; i < numTypes; ++i) {

        type _type = type();

        _type.read(catalogFile, offset);

        types.insert(_type);

        offset += calcTypeSize(_type.numFields);
    }
}